

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.hpp
# Opt level: O3

pair<unsigned_long,_unsigned_long>
beast::detail::base64::decode<void>(void *dest,char *src,size_t len)

{
  void *pvVar1;
  ulong uVar2;
  byte *pbVar3;
  int iVar4;
  long lVar5;
  pair<unsigned_long,_unsigned_long> pVar6;
  uchar c3 [3];
  uchar c4 [4];
  
  pvVar1 = dest;
  pbVar3 = (byte *)src;
  if (len != 0) {
    iVar4 = 0;
    do {
      if (((ulong)*pbVar3 == 0x3d) || (get_inverse()::tab[*pbVar3] == 0xff)) break;
      c4[iVar4] = get_inverse()::tab[*pbVar3];
      iVar4 = iVar4 + 1;
      if (iVar4 == 4) {
        c3[0] = c4[1] >> 4 & 3 | c4[0] << 2;
        c3[1] = c4[2] >> 2 & 0xf | c4[1] << 4;
        c3[2] = c4[2] * '@' + c4[3];
        lVar5 = 0;
        do {
          *(uchar *)((long)pvVar1 + lVar5) = c3[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
        pvVar1 = (void *)((long)pvVar1 + 3);
        iVar4 = 0;
      }
      len = len - 1;
      pbVar3 = pbVar3 + 1;
    } while (len != 0);
    if (iVar4 != 0) {
      c3[0] = c4[1] >> 4 & 3 | c4[0] << 2;
      c3[1] = c4[2] >> 2 & 0xf | c4[1] << 4;
      c3[2] = c4[2] * '@' + c4[3];
      if (1 < iVar4) {
        uVar2 = 0;
        do {
          *(uchar *)((long)pvVar1 + uVar2) = c3[uVar2];
          uVar2 = uVar2 + 1;
        } while (iVar4 - 1 != uVar2);
        pvVar1 = (void *)((long)pvVar1 + uVar2);
      }
    }
  }
  pVar6.first = (long)pvVar1 - (long)dest;
  pVar6.second = (long)pbVar3 - (long)src;
  return pVar6;
}

Assistant:

std::pair<std::size_t, std::size_t>
decode(void* dest, char const* src, std::size_t len)
{
    char* out = static_cast<char*>(dest);
    auto in = reinterpret_cast<unsigned char const*>(src);
    unsigned char c3[3], c4[4];
    int i = 0;
    int j = 0;

    auto const inverse = base64::get_inverse();

    while(len-- && *in != '=')
    {
        auto const v = inverse[*in];
        if(v == -1)
            break;
        ++in;
        c4[i] = v;
        if(++i == 4)
        {
            c3[0] =  (c4[0]        << 2) + ((c4[1] & 0x30) >> 4);
            c3[1] = ((c4[1] & 0xf) << 4) + ((c4[2] & 0x3c) >> 2);
            c3[2] = ((c4[2] & 0x3) << 6) +   c4[3];

            for(i = 0; i < 3; i++)
                *out++ = c3[i];
            i = 0;
        }
    }

    if(i)
    {
        c3[0] = ( c4[0]        << 2) + ((c4[1] & 0x30) >> 4);
        c3[1] = ((c4[1] & 0xf) << 4) + ((c4[2] & 0x3c) >> 2);
        c3[2] = ((c4[2] & 0x3) << 6) +   c4[3];

        for(j = 0; j < i - 1; j++)
            *out++ = c3[j];
    }

    return {out - static_cast<char*>(dest),
        in - reinterpret_cast<unsigned char const*>(src)};
}